

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

char * doctest::failureString(Enum at)

{
  char *pcStack_10;
  Enum at_local;
  
  if ((at & is_warn) == 0) {
    if ((at & is_check) == 0) {
      if ((at & is_require) == 0) {
        pcStack_10 = "";
      }
      else {
        pcStack_10 = "FATAL ERROR";
      }
    }
    else {
      pcStack_10 = "ERROR";
    }
  }
  else {
    pcStack_10 = "WARNING";
  }
  return pcStack_10;
}

Assistant:

const char* failureString(assertType::Enum at) {
    if(at & assertType::is_warn) //!OCLINT bitwise operator in conditional
        return "WARNING";
    if(at & assertType::is_check) //!OCLINT bitwise operator in conditional
        return "ERROR";
    if(at & assertType::is_require) //!OCLINT bitwise operator in conditional
        return "FATAL ERROR";
    return "";
}